

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

bool __thiscall
server_context::can_be_detokenized
          (server_context *this,llama_context *ctx,vector<int,_std::allocator<int>_> *tokens)

{
  int *piVar1;
  int iVar2;
  undefined8 uVar3;
  int *piVar4;
  vector<int,_std::allocator<int>_> *__range1;
  bool bVar5;
  
  uVar3 = llama_get_model(ctx);
  uVar3 = llama_model_get_vocab(uVar3);
  iVar2 = llama_vocab_n_tokens(uVar3);
  piVar4 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  bVar5 = piVar4 == piVar1;
  if ((!bVar5) && (*piVar4 < iVar2 && -1 < *piVar4)) {
    while( true ) {
      piVar4 = piVar4 + 1;
      bVar5 = piVar4 == piVar1;
      if (bVar5) break;
      if (*piVar4 < 0) {
        return bVar5;
      }
      if (iVar2 <= *piVar4) {
        return bVar5;
      }
    }
  }
  return bVar5;
}

Assistant:

bool can_be_detokenized(const struct llama_context * ctx, const std::vector<llama_token> & tokens) {
        const llama_model * model = llama_get_model(ctx);
        const llama_vocab * vocab = llama_model_get_vocab(model);
        const int32_t n_vocab = llama_vocab_n_tokens(vocab);
        for (const auto & token : tokens) {
            if (token < 0 || token >= n_vocab) {
                return false;
            }
        }
        return true;
    }